

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O3

bool __thiscall
vkt::tessellation::anon_unknown_0::
LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
::operator()(LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
             *this,Vector<tcu::Vector<float,_3>,_3> *a,Vector<tcu::Vector<float,_3>,_3> *b)

{
  bool bVar1;
  byte bVar2;
  LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
  *pLVar3;
  float *pfVar4;
  ulong uVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  pLVar3 = this + 4;
  pfVar4 = a->m_data[0].m_data + 1;
  bVar2 = 1;
  uVar5 = 0;
  bVar1 = true;
  do {
    fVar7 = *(float *)(this + uVar5 * 0xc);
    fVar8 = a->m_data[uVar5].m_data[0];
    if (fVar7 < fVar8) break;
    lVar6 = 0;
    fVar9 = fVar8;
    fVar10 = fVar7;
    while ((fVar10 <= fVar9 && (lVar6 != 2))) {
      fVar10 = *(float *)(pLVar3 + lVar6 * 4);
      fVar9 = pfVar4[lVar6];
      lVar6 = lVar6 + 1;
      if (fVar10 < fVar9) goto LAB_007763c5;
    }
    if (fVar8 < fVar7) {
LAB_007763c3:
      bVar2 = 0;
      break;
    }
    lVar6 = 0;
    while ((fVar8 <= fVar7 && (lVar6 != 2))) {
      fVar8 = pfVar4[lVar6];
      fVar7 = *(float *)(pLVar3 + lVar6 * 4);
      lVar6 = lVar6 + 1;
      if (fVar8 < fVar7) goto LAB_007763c3;
    }
    bVar1 = uVar5 < 2;
    uVar5 = uVar5 + 1;
    pLVar3 = pLVar3 + 0xc;
    pfVar4 = pfVar4 + 3;
  } while (uVar5 != 3);
LAB_007763c5:
  return (bool)(bVar1 & bVar2);
}

Assistant:

bool operator() (const SeqT& a, const SeqT& b) const
	{
		for (int i = 0; i < Size; ++i)
		{
			if (m_pred(a[i], b[i]))
				return true;
			if (m_pred(b[i], a[i]))
				return false;
		}
		return false;
	}